

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_map.cpp
# Opt level: O1

void AM_SerializeMarkers(FSerializer *arc)

{
  bool bVar1;
  FSerializer *pFVar2;
  
  bVar1 = FSerializer::BeginObject(arc,"automarkers");
  if (bVar1) {
    pFVar2 = Serialize(arc,"markpointnum",&markpointnum,(int32_t *)0x0);
    pFVar2 = FSerializer::Array<double>(pFVar2,"markpoints",&markpoints[0].x,0x14,false);
    pFVar2 = Serialize(pFVar2,"scale_mtof",&scale_mtof,(double *)0x0);
    pFVar2 = Serialize(pFVar2,"scale_ftom",&scale_ftom,(double *)0x0);
    FSerializer::EndObject(pFVar2);
    return;
  }
  return;
}

Assistant:

void AM_SerializeMarkers(FSerializer &arc)
{
	if (arc.BeginObject("automarkers"))
	{
		arc("markpointnum", markpointnum)
			.Array("markpoints", &markpoints[0].x, AM_NUMMARKPOINTS*2)	// write as a double array.
			("scale_mtof", scale_mtof)
			("scale_ftom", scale_ftom)
			.EndObject();
	}
}